

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O3

Surface * __thiscall SDL2pp::Surface::FillRects(Surface *this,Rect *rects,int count,Uint32 color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Exception *this_00;
  long lVar4;
  Rect *r;
  vector<SDL_Rect,_std::allocator<SDL_Rect>_> sdl_rects;
  vector<SDL_Rect,_std::allocator<SDL_Rect>_> local_48;
  
  local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SDL_Rect *)0x0;
  local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (SDL_Rect *)0x0;
  std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::reserve(&local_48,(long)count);
  if (count != 0) {
    lVar4 = (long)count << 4;
    do {
      if (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SDL_Rect,std::allocator<SDL_Rect>>::_M_realloc_insert<SDL2pp::Rect_const&>
                  ((vector<SDL_Rect,std::allocator<SDL_Rect>> *)&local_48,
                   (iterator)
                   local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish,rects);
      }
      else {
        iVar3 = (rects->super_SDL_Rect).y;
        iVar1 = (rects->super_SDL_Rect).w;
        iVar2 = (rects->super_SDL_Rect).h;
        (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
         super__Vector_impl_data._M_finish)->x = (rects->super_SDL_Rect).x;
        (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
         super__Vector_impl_data._M_finish)->y = iVar3;
        (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
         super__Vector_impl_data._M_finish)->w = iVar1;
        (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
         super__Vector_impl_data._M_finish)->h = iVar2;
        local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      rects = rects + 1;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
  }
  iVar3 = SDL_FillRects(this->surface_,
                        local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                        super__Vector_impl_data._M_start,count,color);
  if (iVar3 == 0) {
    if (local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_FillRects");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Surface& Surface::FillRects(const Rect* rects, int count, Uint32 color) {
	std::vector<SDL_Rect> sdl_rects;
	sdl_rects.reserve(static_cast<size_t>(count));
	for (const Rect* r = rects; r != rects + count; ++r)
		sdl_rects.emplace_back(*r);

	if (SDL_FillRects(surface_, sdl_rects.data(), count, color) != 0)
		throw Exception("SDL_FillRects");
	return *this;
}